

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlDocPtr xmlSAXParseDoc(xmlSAXHandlerPtr sax,xmlChar *cur,int recovery)

{
  xmlParserCtxtPtr ctxt;
  _xmlSAXHandler *p_Var1;
  xmlDocPtr cur_00;
  
  if ((cur != (xmlChar *)0x0) && (ctxt = xmlCreateDocParserCtxt(cur), ctxt != (xmlParserCtxtPtr)0x0)
     ) {
    if (sax == (xmlSAXHandlerPtr)0x0) {
      p_Var1 = (_xmlSAXHandler *)0x0;
    }
    else {
      p_Var1 = ctxt->sax;
      ctxt->sax = sax;
      ctxt->userData = (void *)0x0;
    }
    xmlParseDocument(ctxt);
    cur_00 = ctxt->myDoc;
    if (recovery == 0 && ctxt->wellFormed == 0) {
      xmlFreeDoc(cur_00);
      ctxt->myDoc = (xmlDocPtr)0x0;
      cur_00 = (xmlDocPtr)0x0;
    }
    if (sax != (xmlSAXHandlerPtr)0x0) {
      ctxt->sax = p_Var1;
    }
    xmlFreeParserCtxt(ctxt);
    return cur_00;
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlSAXParseDoc(xmlSAXHandlerPtr sax, const xmlChar *cur, int recovery) {
    xmlDocPtr ret;
    xmlParserCtxtPtr ctxt;
    xmlSAXHandlerPtr oldsax = NULL;

    if (cur == NULL) return(NULL);


    ctxt = xmlCreateDocParserCtxt(cur);
    if (ctxt == NULL) return(NULL);
    if (sax != NULL) {
        oldsax = ctxt->sax;
        ctxt->sax = sax;
        ctxt->userData = NULL;
    }

    xmlParseDocument(ctxt);
    if ((ctxt->wellFormed) || recovery) ret = ctxt->myDoc;
    else {
       ret = NULL;
       xmlFreeDoc(ctxt->myDoc);
       ctxt->myDoc = NULL;
    }
    if (sax != NULL)
	ctxt->sax = oldsax;
    xmlFreeParserCtxt(ctxt);

    return(ret);
}